

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask26_24(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar12 [64];
  
  auVar17 = *(undefined1 (*) [16])(in + 6);
  uVar1 = in[9];
  auVar14._4_4_ = uVar1;
  auVar14._0_4_ = uVar1;
  auVar14._8_4_ = uVar1;
  auVar14._12_4_ = uVar1;
  uVar1 = in[4];
  auVar15._4_4_ = uVar1;
  auVar15._0_4_ = uVar1;
  auVar15._8_4_ = uVar1;
  auVar15._12_4_ = uVar1;
  auVar6 = vpmovsxbd_avx2(ZEXT816(0x100a0400120c06));
  uVar2 = in[0x16];
  auVar7 = vpbroadcastd_avx512vl();
  auVar15 = vpblendd_avx2(auVar15,auVar14,0xc);
  auVar14 = vpinsrd_avx(*(undefined1 (*) [16])(in + 1),in[5] << 2,3);
  auVar15 = vpsrlvd_avx2(auVar15,_DAT_001a1dd0);
  uVar3 = in[0x13];
  auVar8 = vinserti32x4_avx512f
                     (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                          ZEXT116(1) * auVar17,
                                          ZEXT116(0) * auVar17 +
                                          ZEXT116(1) * *(undefined1 (*) [16])(in + 1))),
                      *(undefined1 (*) [16])(in + 0xb),2);
  auVar16._0_16_ = ZEXT116(0) * auVar17 + ZEXT116(1) * auVar14;
  auVar16._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar17;
  auVar9 = vpmovsxbd_avx512f(_DAT_00191d70);
  auVar10 = vpbroadcastd_avx512f(ZEXT416(in[0xf]));
  auVar11._0_48_ = auVar8._0_48_;
  auVar11._48_4_ = auVar10._48_4_;
  auVar11._52_4_ = auVar8._52_4_;
  auVar11._56_4_ = auVar8._56_4_;
  auVar11._60_4_ = auVar8._60_4_;
  auVar7 = vpblendd_avx2(auVar16,auVar7,0x80);
  auVar16 = vpsrlvd_avx2(auVar16,auVar6);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(in + 0x11);
  auVar17 = vpsrlvd_avx2(auVar17,auVar6._0_16_);
  auVar6 = vpermq_avx2(ZEXT1632(auVar15),0x60);
  auVar6 = vpor_avx2(auVar7,auVar6);
  auVar14 = vpsrlvd_avx2(*(undefined1 (*) [16])(in + 0xb),_DAT_0019d410);
  auVar8 = vpermi2d_avx512f(auVar9,auVar11,ZEXT864(*(ulong *)(in + 0x11)));
  auVar6 = vpblendd_avx2(auVar16,auVar6,0x88);
  auVar9 = vpmovsxbd_avx512f(_DAT_00191d90);
  auVar10 = vpmovsxbd_avx512f(_DAT_00191da0);
  auVar11 = vpbroadcastd_avx512f();
  auVar12._60_4_ = auVar11._60_4_;
  auVar12._0_60_ = auVar8._0_60_;
  auVar8 = vpsllvd_avx512f(auVar12,_DAT_001ac4c0);
  uVar4 = in[0x14];
  uVar1 = in[0x15];
  auVar9 = vpermi2d_avx512f(auVar9,ZEXT3264(auVar6),ZEXT464(*in));
  auVar11 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar9 = vpermi2d_avx512f(auVar10,auVar9,ZEXT1664(auVar14));
  auVar10 = vpbroadcastd_avx512f(ZEXT416(in[0x10]));
  auVar13._0_52_ = auVar9._0_52_;
  auVar13._52_4_ = auVar10._52_4_;
  auVar13._56_4_ = auVar9._56_4_;
  auVar13._60_4_ = auVar9._60_4_;
  uVar5 = in[0x17];
  auVar9 = vpermi2q_avx512f(auVar11,auVar13,ZEXT1664(auVar17));
  auVar8 = vpord_avx512f(auVar8,auVar9);
  auVar8 = vmovdqu64_avx512f(auVar8);
  *(undefined1 (*) [64])out = auVar8;
  out[0x10] = uVar4 << 8 | uVar3 >> 0x12;
  out[0x11] = uVar2 << 0x1c | uVar1 << 2 | uVar4 >> 0x18;
  out[0x12] = uVar5 << 0x16 | uVar2 >> 4;
  out[0x13] = uVar5 >> 10;
  return out + 0x14;
}

Assistant:

uint32_t *__fastpackwithoutmask26_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (26 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (26 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (26 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (26 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (26 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (26 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (26 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (26 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (26 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (26 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (26 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (26 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (26 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (26 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (26 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (26 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (26 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (26 - 16);
  ++in;

  return out + 1;
}